

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

int __thiscall Player::attack(Player *this)

{
  string *psVar1;
  pointer pcVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  pointer ppCVar4;
  pointer ppPVar5;
  pointer ppPVar6;
  Country *pCVar7;
  int iVar8;
  uint uVar9;
  int numDefendingDice;
  PlayerState *pPVar10;
  ostream *poVar11;
  long *plVar12;
  GameLoop *pGVar13;
  pointer ppPVar14;
  ulong uVar15;
  long lVar16;
  Country *pCVar17;
  Player *defendingPlayer;
  char *pcVar18;
  Country **neighbour;
  pointer ppCVar19;
  ulong uVar20;
  long *local_70;
  long local_68;
  long local_60 [2];
  Player *local_50;
  Country *local_48;
  ulong local_40;
  Country *local_38;
  
  if (this->currentState != (PlayerState *)0x0) {
    operator_delete(this->currentState,4);
  }
  pPVar10 = (PlayerState *)operator_new(4);
  *pPVar10 = ATTACKING;
  this->currentState = pPVar10;
  notifyAll(this);
  psVar1 = this->strategy->strategyName;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + psVar1->_M_string_length);
  iVar8 = std::__cxx11::string::compare((char *)&local_70);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (iVar8 == 0) {
    iVar8 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,0);
    iVar8 = (int)(char)iVar8;
  }
  else {
    uVar20 = 0;
    local_50 = this;
    do {
      std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"It is Player ",0xd);
      poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'s turn to attack!",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n[ATTACKER] Will you attack?(y/n)",0x21);
      uVar9 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,0);
      if ((char)uVar9 == 'y') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
        poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," has chosen to attack!",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        do {
          std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
          std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
                    ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_70,
                     this->pOwnedCountries);
          showCountries((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_70);
          if (local_70 != (long *)0x0) {
            operator_delete(local_70,local_60[0] - (long)local_70);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "\n[ATTACKER] From which country do you want to attack?(choose 0 to ",0x42);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
          uVar9 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,1);
          if ((((int)uVar9 < 0) ||
              ((int)((ulong)((long)(this->pOwnedCountries->
                                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->pOwnedCountries->
                                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar9))
             || (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
          }
        } while ((((int)uVar9 < 0) ||
                 (pvVar3 = this->pOwnedCountries,
                 (int)((ulong)((long)(pvVar3->
                                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar3->
                                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar9)
                 ) || (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0));
        ppCVar19 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar3->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar19 >> 3) <=
            (ulong)uVar9) {
LAB_0011029b:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        pCVar17 = ppCVar19[uVar9];
        pCVar7 = pCVar17;
        if (*pCVar17->pNumberOfTroops < 2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Country ",8);
          pcVar2 = (pCVar17->cyName->_M_dataplus)._M_p;
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + pCVar17->cyName->_M_string_length);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_70,local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     " does not have enough armies to attack. Choose a different country. Proceeding...\n"
                     ,0x52);
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
        else {
          do {
            do {
              local_38 = pCVar7;
              local_40 = uVar20;
              std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\nCountry ",9);
              pcVar2 = (pCVar17->cyName->_M_dataplus)._M_p;
              local_70 = local_60;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,pcVar2,pcVar2 + pCVar17->cyName->_M_string_length);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)local_70,local_68);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," has ",5);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," neighbour(s):\n",0xf);
              if (local_70 != local_60) {
                operator_delete(local_70,local_60[0] + 1);
              }
              ppCVar4 = (pCVar17->pAdjCountries->
                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish;
              for (ppCVar19 = (pCVar17->pAdjCountries->
                              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                              _M_impl.super__Vector_impl_data._M_start; ppCVar19 != ppCVar4;
                  ppCVar19 = ppCVar19 + 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\t\tName: ",8);
                pcVar2 = ((*ppCVar19)->cyName->_M_dataplus)._M_p;
                local_70 = local_60;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,pcVar2,pcVar2 + (*ppCVar19)->cyName->_M_string_length
                          );
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_70,local_68);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," Armies: ",9);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(*ppCVar19)->pNumberOfTroops)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," Owned by: Player ",0x12);
                plVar12 = (long *)std::ostream::operator<<(poVar11,*(*ppCVar19)->pPlayerOwnerId);
                std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                std::ostream::put((char)plVar12);
                std::ostream::flush();
                if (local_70 != local_60) {
                  operator_delete(local_70,local_60[0] + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "\n[ATTACKER] Which country would you like to attack?(0 to ",0x39);
              pCVar17 = local_38;
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
              this = local_50;
              uVar9 = (*local_50->strategy->_vptr_PlayerStrategy[1])(local_50->strategy,2);
              if ((((int)uVar9 < 0) ||
                  ((int)((ulong)((long)(pCVar17->pAdjCountries->
                                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar17->pAdjCountries->
                                      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3) < (int)uVar9
                  )) || (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
              }
              uVar20 = local_40;
              pCVar7 = local_38;
            } while ((int)uVar9 < 0);
            ppCVar19 = (pCVar17->pAdjCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            uVar15 = (long)(pCVar17->pAdjCountries->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar19;
          } while (((int)(uVar15 >> 3) < (int)uVar9) ||
                  (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0));
          if ((ulong)((long)uVar15 >> 3) <= (ulong)uVar9) goto LAB_0011029b;
          local_48 = ppCVar19[uVar9];
          if (*pCVar17->pPlayerOwnerId == *local_48->pPlayerOwnerId) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n",0x3f);
            uVar20 = local_40;
          }
          else {
            do {
              std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\n[ATTACKER] How many dice will Player ",0x26);
              poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," roll?(1 to ",0xc);
              if (*pCVar17->pNumberOfTroops < 4) {
                plVar12 = (long *)std::ostream::operator<<
                                            (&std::cout,*pCVar17->pNumberOfTroops + -1);
                lVar16 = 1;
                pcVar18 = ")";
              }
              else {
                lVar16 = 2;
                plVar12 = &std::cout;
                pcVar18 = "3)";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar12,pcVar18,lVar16);
              iVar8 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,3);
              if ((((iVar8 < 1) || (3 < iVar8)) || (*pCVar17->pNumberOfTroops <= iVar8)) ||
                 (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
              }
            } while (((iVar8 < 1) || (3 < iVar8)) ||
                    ((*pCVar17->pNumberOfTroops <= iVar8 ||
                     (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0))));
            do {
              std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\n[DEFENDER] How many dice will Player ",0x26);
              pCVar17 = local_48;
              poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*local_48->pPlayerOwnerId);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," roll?(1 to ",0xc);
              pcVar18 = "1)";
              if (1 < *pCVar17->pNumberOfTroops) {
                pcVar18 = "2)";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,2);
              numDefendingDice =
                   (*local_50->strategy->_vptr_PlayerStrategy[1])(local_50->strategy,5);
              if (((numDefendingDice - 3U < 0xfffffffe) ||
                  (*local_48->pNumberOfTroops < numDefendingDice)) ||
                 (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
              }
            } while (((numDefendingDice - 3U < 0xfffffffe) ||
                     (*local_48->pNumberOfTroops < numDefendingDice)) ||
                    (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0));
            pGVar13 = GameLoop::getInstance();
            uVar20 = local_40;
            this = local_50;
            ppPVar5 = (pGVar13->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            ppPVar6 = (pGVar13->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppPVar5 == ppPVar6) {
              defendingPlayer = (Player *)0x0;
            }
            else {
              do {
                ppPVar14 = ppPVar5 + 1;
                defendingPlayer = *ppPVar5;
                if (*(*ppPVar5)->pPlayerId == *local_48->pPlayerOwnerId) break;
                defendingPlayer = (Player *)0x0;
                ppPVar5 = ppPVar14;
              } while (ppPVar14 != ppPVar6);
            }
            if (defendingPlayer == (Player *)0x0) {
              if (local_50->currentState != (PlayerState *)0x0) {
                operator_delete(local_50->currentState,4);
              }
              pPVar10 = (PlayerState *)operator_new(4);
              *pPVar10 = IDLE;
              this->currentState = pPVar10;
              (*this->strategy->_vptr_PlayerStrategy[5])();
            }
            else {
              iVar8 = executeAttack(local_50,local_38,local_48,defendingPlayer,iVar8,
                                    numDefendingDice);
              if (iVar8 == 1) {
                lVar16 = 0x21;
                pcVar18 = "\n[ATTACK SUCCEEDED] - Proceeding.";
              }
              else {
                lVar16 = 0x3f;
                pcVar18 = "\n[ATTACK FAILED] - Make sure that you chose appropriate values.";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar18,lVar16);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
              std::ostream::put(-0x80);
              std::ostream::flush();
              this = local_50;
              uVar20 = local_40;
            }
            if (defendingPlayer == (Player *)0x0) {
              return -1;
            }
          }
        }
      }
      else {
        if ((uVar9 & 0xff) == 0x6e) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
          poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," has chosen NOT to attack!",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          goto LAB_0011024f;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nInvalid Input. Please try again.\n",0x22);
      }
      uVar9 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar9;
    } while (uVar9 != 10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nInvalid user input for 10 consecutive prompts, aborting action.\n",0x41);
LAB_0011024f:
    if (this->currentState != (PlayerState *)0x0) {
      operator_delete(this->currentState,4);
    }
    pPVar10 = (PlayerState *)operator_new(4);
    *pPVar10 = IDLE;
    this->currentState = pPVar10;
    (*this->strategy->_vptr_PlayerStrategy[5])();
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int Player::attack() {

    char playerChoice = 0;
    int fromCountryIndex;
    int toCountryIndex;
    int numAttackingDice;
    int numDefendingDice;

    this->setPlayerState(PlayerState::ATTACKING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::ATTACK);
    }

    /* USER DECISION TO ATTACK OR NOT*/
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }
        failsafeCounter++;

        std::cin.clear();
        std::cout << "It is Player " << this->getPlayerId() << "'s turn to attack!" << std::endl;
        std::cout << "\n[ATTACKER] Will you attack?(y/n)";
        playerChoice = strategy->yesOrNo(StrategyContext::ATTACK);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid Input. Please try again.\n";
            continue;
        }

        if (playerChoice == 'y') {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to attack!" << std::endl;
            /*USER CHOOSES FROM WHICH COUNTRY TO ATTACK*/
            fromCountryIndex = getAttackingCountry(this);
        } else {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to attack!" << std::endl;
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }

        // Get the country to attack from
        Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
        if (fromCountry->getNumberOfTroops() < 2) {
            std::cout << "Country " << fromCountry->getCountryName()
                      << " does not have enough armies to attack. Choose a different country. Proceeding...\n";
            continue;
        }

        /* USER CHOOSES WHICH COUNTRY TO ATTACK*/
        toCountryIndex = getDefendingCountry(fromCountry, this);

        Map::Country *toCountry = fromCountry->getAdjCountries()->at(toCountryIndex);
        if (fromCountry->getPlayerOwnerID() == toCountry->getPlayerOwnerID()) {
            std::cout << "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n";
            continue;
        }

        /*ATTACKER CHOOSES HOW MANY DICE TO ROLL*/
        numAttackingDice = getNumAttackingDice(this, fromCountry);

        /*DEFENDER CHOOSES HOW MANY DICE TO ROLL*/
        numDefendingDice = getNumDefendingDice(toCountry, this);

        /* GET THE DEFENDING PLAYER */
        Player *defendingPlayer = nullptr;
        for (auto &i : *GameLoop::getInstance()->getAllPlayers()) {
            if (i->getPlayerId() == toCountry->getPlayerOwnerID()) {
                defendingPlayer = i;
                break;
            }
        }
        if (defendingPlayer == nullptr) {
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::FAILED;
        }

        if (this->executeAttack(fromCountry, toCountry, defendingPlayer, numAttackingDice, numDefendingDice) == PlayerAction::SUCCEEDED) {
            std::cout << "\n[ATTACK SUCCEEDED] - Proceeding." << std::endl;
            continue;
        } else {
            std::cout << "\n[ATTACK FAILED] - Make sure that you chose appropriate values." << std::endl;
            continue;
        }
    } while (true);
}